

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::CheckerVisitor::applyKnownInvocationToScope(CheckerVisitor *this,ValueRef *value)

{
  TreeOp TVar1;
  key_type pFVar2;
  SQChar *pSVar3;
  pointer pMVar4;
  long *plVar5;
  bool bVar6;
  Expr *pEVar7;
  mapped_type *ppFVar8;
  iterator iVar9;
  ulong uVar10;
  VarScope *pVVar11;
  pointer pMVar12;
  mapped_type pFVar13;
  long lVar14;
  bool bVar15;
  int32_t dummy;
  key_type local_48;
  SQChar *pSStack_40;
  _Map_base<const_SQCompilation::FunctionDecl_*,_std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_38;
  
  if (1 < value->state - VRS_EXPRESSION) {
    pFVar13 = (mapped_type)0x0;
    goto LAB_00158adc;
  }
  local_48 = (key_type)CONCAT44(local_48._4_4_,0xffffffff);
  pFVar13 = (mapped_type)0x0;
  pEVar7 = maybeEval(this,value->expression,(int32_t *)&local_48,false);
  TVar1 = (pEVar7->super_Node)._op;
  if (TVar1 == TO_EXTERNAL_VALUE) {
LAB_00158ac5:
    applyUnknownInvocationToScope(this);
    bVar6 = false;
LAB_00158ad0:
    pFVar13 = (mapped_type)0x0;
  }
  else {
    bVar6 = true;
    if (TVar1 == TO_DECL_EXPR) {
      pFVar2 = (key_type)pEVar7[1].super_Node.super_ArenaObj._vptr_ArenaObj;
      TVar1 = (pFVar2->super_Decl).super_Statement.super_Node._op;
      if (TVar1 - TO_FUNCTION < 2) {
        local_48 = pFVar2;
        ppFVar8 = std::__detail::
                  _Map_base<const_SQCompilation::FunctionDecl_*,_std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_SQCompilation::FunctionDecl_*,_std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->functionInfoMap,&local_48);
        pFVar13 = *ppFVar8;
      }
      else {
        if (TVar1 != TO_CLASS) goto LAB_00158ac5;
        uVar10 = (ulong)*(uint *)&(pFVar2->_parameters)._arena;
        bVar6 = true;
        if (uVar10 == 0) goto LAB_00158ad0;
        pSVar3 = pFVar2->_name;
        local_38 = (_Map_base<const_SQCompilation::FunctionDecl_*,_std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->functionInfoMap;
        pFVar13 = (mapped_type)0x0;
        lVar14 = 0;
        do {
          bVar6 = true;
          if (*(int *)(*(long *)(pSVar3 + lVar14 + 8) + 0x18) == 0x3d) {
            local_48 = *(key_type *)(*(long *)(pSVar3 + lVar14 + 8) + 0x20);
            bVar15 = (local_48->super_Decl).super_Statement.super_Node._op != TO_CONSTRUCTOR;
            if (!bVar15) {
              ppFVar8 = std::__detail::
                        _Map_base<const_SQCompilation::FunctionDecl_*,_std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[](local_38,&local_48);
              pFVar13 = *ppFVar8;
            }
          }
          else {
            bVar15 = true;
          }
        } while ((bVar15) &&
                (bVar15 = uVar10 * 0x18 + -0x18 != lVar14, lVar14 = lVar14 + 0x18, bVar15));
      }
    }
  }
  if (!bVar6) {
    return;
  }
LAB_00158adc:
  if (pFVar13 != (mapped_type)0x0) {
    pMVar12 = (pFVar13->modifiable).
              super__Vector_base<SQCompilation::FunctionInfo::Modifiable,_std::allocator<SQCompilation::FunctionInfo::Modifiable>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar4 = (pFVar13->modifiable).
             super__Vector_base<SQCompilation::FunctionInfo::Modifiable,_std::allocator<SQCompilation::FunctionInfo::Modifiable>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar12 != pMVar4) {
      do {
        local_48 = pMVar12->owner;
        pSStack_40 = pMVar12->name;
        pVVar11 = this->currentScope;
        do {
          if (pVVar11->owner == local_48) goto LAB_00158b1f;
          pVVar11 = pVVar11->parent;
        } while (pVVar11 != (VarScope *)0x0);
        pVVar11 = (VarScope *)0x0;
LAB_00158b1f:
        if (((pVVar11 != (VarScope *)0x0) &&
            (iVar9 = std::
                     _Hashtable<const_char_*,_std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_SQCompilation::StringEqualer,_SQCompilation::StringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(pVVar11->symbols)._M_h,&pSStack_40),
            iVar9.
            super__Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true>
            ._M_cur != (__node_type *)0x0)) &&
           (*(int *)(**(long **)((long)iVar9.
                                       super__Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true>
                                       ._M_cur + 0x10) + 8) == 4)) {
          if (this->currentInfo != (FunctionInfo *)0x0) {
            FunctionInfo::addModifiable
                      (this->currentInfo,
                       *(SQChar **)
                        ((long)iVar9.
                               super__Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true>
                               ._M_cur + 8),
                       *(FunctionDecl **)
                        (*(long *)(**(long **)((long)iVar9.
                                                  super__Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true>
                                                  ._M_cur + 0x10) + 0x10) + 8));
          }
          plVar5 = *(long **)((long)iVar9.
                                    super__Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true>
                                    ._M_cur + 0x10);
          if (*(int *)(*plVar5 + 8) == 4) {
            *(undefined4 *)(plVar5 + 1) = 4;
            plVar5[2] = 0;
          }
          plVar5[9] = 0;
          *(undefined4 *)(plVar5 + 7) = 0;
          *(undefined4 *)(plVar5 + 5) = 0;
        }
        pMVar12 = pMVar12 + 1;
      } while (pMVar12 != pMVar4);
    }
  }
  return;
}

Assistant:

void CheckerVisitor::applyKnownInvocationToScope(const ValueRef *value) {
  const FunctionInfo *info = nullptr;

  if (value->hasValue()) {
    const Expr *expr = maybeEval(value->expression);
    assert(expr != nullptr);

    if (expr->op() == TO_DECL_EXPR) { //-V522
      const Decl *decl = static_cast<const DeclExpr *>(expr)->declaration();
      if (decl->op() == TO_FUNCTION || decl->op() == TO_CONSTRUCTOR) {
        info = functionInfoMap[static_cast<const FunctionDecl *>(decl)];
      }
      else if (decl->op() == TO_CLASS) {
        const ClassDecl *klass = static_cast<const ClassDecl *>(decl);
        for (auto &m : klass->members()) {
          const Expr *me = m.value;
          if (me->op() == TO_DECL_EXPR) {
            const Decl *de = static_cast<const DeclExpr *>(m.value)->declaration();
            if (de->op() == TO_CONSTRUCTOR) {
              info = functionInfoMap[static_cast<const FunctionDecl *>(de)];
              break;
            }
          }
        }
      }
      else {
        applyUnknownInvocationToScope();
        return;
      }
    }
    else if (expr->op() == TO_EXTERNAL_VALUE) {
      applyUnknownInvocationToScope();
      return;
    }
  }

  if (!info) {
    // probably it is class constructor
    return;
  }

  for (auto s : info->modifiable) {
    VarScope *scope = currentScope->findScope(s.owner);
    if (!scope)
      continue;

    auto it = scope->symbols.find(s.name);
    if (it != scope->symbols.end()) {
      if (it->second->isConstant())
        continue;

      if (currentInfo) {
        currentInfo->addModifiable(it->first, it->second->info->ownedScope->owner);
      }
      it->second->kill();
    }
  }
}